

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O3

bool_t prf_vertex_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint *puVar3;
  prf_vertex_pool_s **pppVar4;
  uint uVar5;
  prf_node_t *node_00;
  uint16_t *puVar6;
  uint16_t *puVar7;
  prf_nodeinfo_t *ppVar8;
  prf_model_t *ppVar9;
  prf_vertex_pool_s *ppVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  puVar3 = (uint *)node->data;
  uVar12 = *puVar3;
  pppVar4 = state->model->vertextras;
  if (pppVar4 != (prf_vertex_pool_s **)0x0) {
    uVar5 = prf_array_count(pppVar4);
    if (0 < (int)uVar5) {
      uVar11 = 0;
      do {
        uVar12 = uVar12 + state->model->vertextras[uVar11]->position;
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
  }
  bf_put_uint16_be(bfile,node->opcode);
  bf_put_int16_be(bfile,node->length);
  bf_put_int32_be(bfile,uVar12);
  node_00 = prf_node_create();
  if (8 < *puVar3) {
    uVar12 = 8;
    do {
      puVar6 = (uint16_t *)(node->data + uVar12);
      puVar7 = puVar6 + 2;
      uVar1 = *puVar6;
      node_00->opcode = uVar1;
      uVar2 = puVar6[1];
      node_00->length = uVar2;
      if (uVar2 == 4) {
        puVar7 = (uint16_t *)0x0;
      }
      node_00->data = (uint8_t *)puVar7;
      ppVar8 = prf_nodeinfo_get(uVar1);
      if ((ppVar8 == (prf_nodeinfo_t *)0x0) ||
         (ppVar8->save_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
        prf_debug(6,"saving node of type %d",(ulong)node->opcode);
        bf_put_uint16_be(bfile,node_00->opcode);
        bf_put_uint16_be(bfile,node_00->length);
        if (4 < node_00->length) {
          bf_write(bfile,node_00->data,node_00->length - 4);
        }
      }
      else {
        (*ppVar8->save_f)(node_00,state,bfile);
      }
      uVar12 = uVar12 + node_00->length;
    } while (uVar12 < *puVar3);
  }
  pppVar4 = state->model->vertextras;
  if (pppVar4 != (prf_vertex_pool_s **)0x0) {
    uVar12 = prf_array_count(pppVar4);
    if (0 < (int)uVar12) {
      ppVar9 = state->model;
      uVar11 = 0;
      do {
        ppVar10 = ppVar9->vertextras[uVar11];
        if (ppVar10->position != 0) {
          uVar13 = 0;
          do {
            puVar7 = (uint16_t *)(ppVar10->data + uVar13);
            uVar1 = *puVar7;
            node_00->opcode = uVar1;
            uVar2 = puVar7[1];
            node_00->length = uVar2;
            puVar6 = (uint16_t *)0x0;
            if (uVar2 != 4) {
              puVar6 = puVar7 + 2;
            }
            node_00->data = (uint8_t *)puVar6;
            ppVar8 = prf_nodeinfo_get(uVar1);
            if ((ppVar8 == (prf_nodeinfo_t *)0x0) ||
               (ppVar8->save_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
              prf_debug(6,"saving extra node of type %d",(ulong)node->opcode);
              bf_put_uint16_be(bfile,node_00->opcode);
              bf_put_uint16_be(bfile,node_00->length);
              if (4 < node_00->length) {
                bf_write(bfile,node_00->data,node_00->length - 4);
              }
            }
            else {
              (*ppVar8->save_f)(node_00,state,bfile);
            }
            uVar5 = (int)uVar13 + (uint)node_00->length;
            uVar13 = (ulong)uVar5;
            ppVar9 = state->model;
            ppVar10 = ppVar9->vertextras[uVar11];
          } while (uVar5 < ppVar10->position);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar12);
    }
  }
  node_00->data = (uint8_t *)0x0;
  prf_node_destroy(node_00);
  return 1;
}

Assistant:

static
bool_t
prf_vertex_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    node_data * vpdata;
    int32_t length;
    prf_node_t * subnode;
    uint32_t curptr;

    assert( node != NULL && state != NULL && bfile != NULL );

    vpdata = (node_data *) node->data;
    length = vpdata->length;

    if ( state->model->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( state->model->vertextras );
        for ( i = 0; i < count; i++ ) 
            length += state->model->vertextras[i]->position;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_int16_be( bfile, node->length );
    bf_put_int32_be( bfile, length );

    subnode = prf_node_create();
    curptr = 8;
    while ( curptr < (uint32_t) vpdata->length ) {
        uint16_t * uint16ptr;
        prf_nodeinfo_t * nodeinfo;

        uint16ptr = (uint16_t *) (node->data + curptr);
        subnode->opcode = uint16ptr[0];
        subnode->length = uint16ptr[1];
        subnode->data = node->data + curptr + 4;
        if ( subnode->length == 4 )
            subnode->data = NULL;
        nodeinfo = prf_nodeinfo_get( subnode->opcode );
        if ( nodeinfo != NULL && nodeinfo->save_f != NULL ) {
            (*(nodeinfo->save_f))( subnode, state, bfile );
        } else {
            prf_debug( 6, "saving node of type %d", node->opcode );
            bf_put_uint16_be( bfile, subnode->opcode );
            bf_put_uint16_be( bfile, subnode->length );
            if ( subnode->length > 4 )
                bf_write( bfile, subnode->data, subnode->length - 4 );
        }
        curptr += subnode->length;
    }

    if ( state->model->vertextras != NULL ) {
        int i, count;
        count = prf_array_count( state->model->vertextras );
        for ( i = 0; i < count; i++ ) {
            curptr = 0;
            while ( curptr < state->model->vertextras[i]->position ) {
                uint16_t * uint16ptr;
		prf_nodeinfo_t * nodeinfo;

		uint16ptr = (uint16_t *)
                    (state->model->vertextras[i]->data + curptr);
		subnode->opcode = uint16ptr[0];
		subnode->length = uint16ptr[1];
                subnode->data = state->model->vertextras[i]->data + curptr + 4;
                if ( subnode->length == 4 )
                    subnode->data = NULL;
		nodeinfo = prf_nodeinfo_get( subnode->opcode );
                if ( nodeinfo != NULL && nodeinfo->save_f != NULL ) {
                    (*(nodeinfo->save_f))( subnode, state, bfile );
                } else {
                    prf_debug( 6, "saving extra node of type %d", node->opcode );
                    bf_put_uint16_be( bfile, subnode->opcode );
                    bf_put_uint16_be( bfile, subnode->length );
                    if ( subnode->length > 4 )
                        bf_write( bfile, subnode->data, subnode->length - 4 );
                }
                curptr += subnode->length;
            }
        }
    }

    subnode->data = NULL;
    prf_node_destroy( subnode );

    return TRUE;
}